

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadTime(CSzBitUi64s *p,UInt32 num,CSzData *sd2,CBuf *tempBufs,UInt32 numTempBufs,
             ISzAlloc *alloc)

{
  Byte *pBVar1;
  SRes SVar2;
  CNtfsFileTime *pCVar3;
  uint local_74;
  int __result___1;
  UInt32 index;
  int __result__;
  Byte external;
  Byte *defs;
  CNtfsFileTime *vals;
  UInt32 *pUStack_50;
  UInt32 i;
  CSzData sd;
  ISzAlloc *alloc_local;
  UInt32 numTempBufs_local;
  CBuf *tempBufs_local;
  CSzData *sd2_local;
  UInt32 num_local;
  CSzBitUi64s *p_local;
  
  sd.Size = (size_t)alloc;
  __result___1 = ReadBitVector(sd2,num,&p->Defs,alloc);
  p_local._4_4_ = __result___1;
  if (__result___1 == 0) {
    if (sd2->Size == 0) {
      p_local._4_4_ = 0x10;
    }
    else {
      sd2->Size = sd2->Size - 1;
      pBVar1 = sd2->Data;
      sd2->Data = pBVar1 + 1;
      index._3_1_ = *pBVar1;
      if (index._3_1_ == '\0') {
        pUStack_50 = (UInt32 *)sd2->Data;
        sd.Data = (Byte *)sd2->Size;
      }
      else {
        SVar2 = SzReadNumber32(sd2,&local_74);
        if (SVar2 != 0) {
          return SVar2;
        }
        if (numTempBufs <= local_74) {
          return 0x10;
        }
        pUStack_50 = (UInt32 *)tempBufs[local_74].data;
        sd.Data = (Byte *)tempBufs[local_74].size;
      }
      if (num == 0) {
        p->Vals = (CNtfsFileTime *)0x0;
      }
      else {
        pCVar3 = (CNtfsFileTime *)(**(code **)sd.Size)(sd.Size,(ulong)num << 3);
        p->Vals = pCVar3;
        if (pCVar3 == (CNtfsFileTime *)0x0) {
          return 2;
        }
      }
      pCVar3 = p->Vals;
      pBVar1 = p->Defs;
      for (vals._4_4_ = 0; vals._4_4_ < num; vals._4_4_ = vals._4_4_ + 1) {
        if (((uint)pBVar1[vals._4_4_ >> 3] & 0x80 >> ((byte)vals._4_4_ & 7)) == 0) {
          pCVar3[vals._4_4_].Low = 0;
          pCVar3[vals._4_4_].High = 0;
        }
        else {
          if (sd.Data < (Byte *)0x8) {
            return 0x10;
          }
          pCVar3[vals._4_4_].Low = *pUStack_50;
          pCVar3[vals._4_4_].High = pUStack_50[1];
          sd.Data = sd.Data + -8;
          pUStack_50 = pUStack_50 + 2;
        }
      }
      if (index._3_1_ == '\0') {
        sd2->Data = (Byte *)pUStack_50;
        sd2->Size = (size_t)sd.Data;
      }
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static MY_NO_INLINE SRes ReadTime(CSzBitUi64s *p, UInt32 num,
    CSzData *sd2,
    const CBuf *tempBufs, UInt32 numTempBufs,
    ISzAlloc *alloc)
{
  CSzData sd;
  UInt32 i;
  CNtfsFileTime *vals;
  Byte *defs;
  Byte external;
  
  RINOK(ReadBitVector(sd2, num, &p->Defs, alloc));
  
  SZ_READ_BYTE_SD(sd2, external);
  if (external == 0)
    sd = *sd2;
  else
  {
    UInt32 index;
    RINOK(SzReadNumber32(sd2, &index));
    if (index >= numTempBufs)
      return SZ_ERROR_ARCHIVE;
    sd.Data = tempBufs[index].data;
    sd.Size = tempBufs[index].size;
  }
  
  MY_ALLOC_ZE(CNtfsFileTime, p->Vals, num, alloc);
  vals = p->Vals;
  defs = p->Defs;
  for (i = 0; i < num; i++)
    if (SzBitArray_Check(defs, i))
    {
      if (sd.Size < 8)
        return SZ_ERROR_ARCHIVE;
      vals[i].Low = GetUi32(sd.Data);
      vals[i].High = GetUi32(sd.Data + 4);
      SKIP_DATA2(sd, 8);
    }
    else
      vals[i].High = vals[i].Low = 0;
  
  if (external == 0)
    *sd2 = sd;
  
  return SZ_OK;
}